

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O0

int __thiscall trng::negative_binomial_dist::operator()(negative_binomial_dist *this,lcg64_shift *r)

{
  int iVar1;
  iterator first;
  iterator last;
  size_t sVar2;
  size_type sVar3;
  long in_RDI;
  negative_binomial_dist *pnVar4;
  double dVar5;
  int x_i;
  size_t x;
  double p;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  negative_binomial_dist *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_18;
  
  pnVar4 = (negative_binomial_dist *)
           utility::uniformco<double,trng::lcg64_shift>((lcg64_shift *)0x38c362);
  this_00 = pnVar4;
  first = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  last = std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sVar2 = utility::
          discrete<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last._M_current);
  iVar1 = (int)sVar2;
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10));
  if (sVar2 + 1 == sVar3) {
    local_18 = cdf(this_00,in_stack_ffffffffffffffac);
    for (local_18 = (double)pnVar4 - local_18; 0.0 < local_18; local_18 = local_18 - dVar5) {
      iVar1 = iVar1 + 1;
      dVar5 = pdf(this_00,in_stack_ffffffffffffffac);
    }
  }
  return iVar1;
}

Assistant:

int operator()(R &r) {
      double p{utility::uniformco<double>(r)};
      const std::size_t x{utility::discrete(p, P.P_.begin(), P.P_.end())};
      int x_i{static_cast<int>(x)};
      if (x + 1 == P.P_.size()) {
        p -= cdf(x_i);
        while (p > 0) {
          ++x_i;
          p -= pdf(x_i);
        }
      }
      return x_i;
    }